

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int * cond_cost_list(AV1_COMP *cpi,int *cost_list)

{
  bool bVar1;
  int *local_20;
  int use_cost_list;
  int *cost_list_local;
  AV1_COMP *cpi_local;
  
  bVar1 = false;
  if ((cpi->sf).mv_sf.subpel_search_method != '\0') {
    bVar1 = (cpi->sf).mv_sf.use_fullpel_costlist != 0;
  }
  local_20 = cost_list;
  if (!bVar1) {
    local_20 = (int *)0x0;
  }
  return local_20;
}

Assistant:

static inline int *cond_cost_list(const struct AV1_COMP *cpi, int *cost_list) {
  const int use_cost_list = cpi->sf.mv_sf.subpel_search_method != SUBPEL_TREE &&
                            cpi->sf.mv_sf.use_fullpel_costlist;
  return use_cost_list ? cost_list : NULL;
}